

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  char *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  wchar_t *pwVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  int i;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 local_38;
  
  uVar13 = this->num_digits_;
  uVar5 = this->exp_ + uVar13;
  uVar4 = *(uint *)&(this->specs_).field_0x4;
  local_38 = in_RAX;
  if ((char)uVar4 == '\x01') {
    pcVar1 = this->digits_;
    *it = (int)*pcVar1;
    iVar8 = (this->specs_).precision;
    iVar10 = iVar8 - uVar13;
    bVar7 = (byte)((uint)*(undefined4 *)&(this->specs_).field_0x4 >> 0x1d) & 1 &
            (iVar10 != 0 && (int)uVar13 <= iVar8);
    if (((int)uVar13 < 2) && (bVar7 == 0)) {
      pwVar3 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pwVar3 = it + 2;
    }
    pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(pcVar1 + 1,pcVar1 + (int)uVar13,pwVar3);
    if (bVar7 != 0) {
      local_38 = CONCAT44(local_38._4_4_,0x30);
      pwVar3 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar3,iVar10);
    }
    *pwVar3 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x18 & 1) == 0) << 5 | 0x45;
    pwVar3 = write_exponent<wchar_t,wchar_t*>(uVar5 - 1,pwVar3 + 1);
    return pwVar3;
  }
  if (this->exp_ < 0) {
    if ((int)uVar5 < 1) {
      *it = L'0';
      iVar8 = -uVar5;
      if (uVar13 == 0) {
        iVar10 = (this->specs_).precision;
        iVar12 = iVar8;
        if (SBORROW4(iVar10,iVar8) != (int)(iVar10 + uVar5) < 0) {
          iVar12 = iVar10;
        }
        if (-1 < iVar10) {
          iVar8 = iVar12;
        }
      }
      if (0 < (int)uVar13 && ((this->specs_).field_0x7 & 0x20) == 0) {
        do {
          if (this->digits_[(ulong)uVar13 - 1] != '0') goto LAB_01b02dff;
          bVar2 = 1 < (int)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar2);
        uVar13 = 0;
      }
      if (iVar8 == 0 && uVar13 == 0) {
        return it + 1;
      }
LAB_01b02dff:
      it[1] = this->decimal_point_;
      local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20);
      local_38 = CONCAT44(local_38._4_4_,0x30);
      pwVar3 = std::__fill_n_a<wchar_t*,int,wchar_t>(it + 2,iVar8);
      pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + (int)uVar13,pwVar3);
      return pwVar3;
    }
    uVar11 = (ulong)uVar5;
    if (uVar5 < 4 || (uVar4 & 0xff0000) == 0) {
      it = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + uVar11,it);
    }
    else {
      uVar14 = (ulong)uVar5 % 3;
      iVar8 = 0;
      if ((int)uVar14 == 0) {
        uVar14 = 3;
        iVar8 = 0;
      }
      for (; iVar8 < (int)uVar5; iVar8 = iVar8 + iVar10) {
        if (0 < iVar8) {
          *it = (int)(char)(this->specs_).field_0x6;
          it = it + 1;
        }
        iVar10 = (int)uVar14;
        it = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(this->digits_ + iVar8,this->digits_ + iVar8 + uVar14,it)
        ;
        uVar14 = 3;
      }
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      uVar13 = this->num_digits_;
      lVar6 = (long)(int)uVar13;
      pcVar1 = this->digits_;
      uVar4 = uVar5;
      if ((int)uVar13 < (int)uVar5) {
        uVar4 = uVar13;
      }
      do {
        if (lVar6 <= (long)uVar11) {
LAB_01b02eb1:
          if (uVar4 != uVar5) {
            *it = this->decimal_point_;
            it = it + 1;
          }
          pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char_const*,wchar_t*>(pcVar1 + uVar11,pcVar1 + (int)uVar4,it);
          return pwVar3;
        }
        if (pcVar1[lVar6 + -1] != '0') {
          uVar4 = (uint)lVar6;
          goto LAB_01b02eb1;
        }
        lVar6 = lVar6 + -1;
      } while( true );
    }
    *it = this->decimal_point_;
    pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>
                       (this->digits_ + uVar11,this->digits_ + this->num_digits_,it + 1);
    if ((this->specs_).precision <= this->num_digits_) {
      return pwVar3;
    }
  }
  else {
    if ((int)uVar5 < 4 || (uVar4 & 0xff0000) == 0) {
      pwVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + (int)uVar13,it);
      local_38._0_4_ = 0x30;
      it = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar3,uVar5 - this->num_digits_);
    }
    else {
      iVar8 = 0;
      uVar11 = (ulong)uVar5 % 3;
      if ((int)uVar11 == 0) {
        uVar11 = 3;
      }
      local_38._0_4_ = (undefined4)in_RAX;
      local_38._4_4_ = uVar5;
      for (; iVar10 = (int)uVar11, iVar8 < (int)uVar5; iVar8 = iVar8 + iVar10) {
        if (0 < iVar8) {
          *it = (int)(char)(this->specs_).field_0x6;
          it = it + 1;
        }
        iVar12 = this->num_digits_ - iVar8;
        if (iVar12 == 0 || this->num_digits_ < iVar8) {
          local_38._0_4_ = 0x30;
          it = std::__fill_n_a<wchar_t*,int,wchar_t>(it,uVar11,&local_38);
        }
        else {
          iVar9 = iVar12;
          if (iVar10 < iVar12) {
            iVar9 = iVar10;
          }
          it = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,wchar_t*>
                         (this->digits_ + iVar8,this->digits_ + iVar8 + iVar9,it);
          uVar5 = local_38._4_4_;
          if (iVar12 < iVar10) {
            local_38._0_4_ = 0x30;
            it = std::__fill_n_a<wchar_t*,int,wchar_t>(it,iVar10 - iVar9,&local_38);
            uVar5 = local_38._4_4_;
          }
        }
        uVar11 = 3;
      }
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      return it;
    }
    pwVar3 = it + 1;
    *it = this->decimal_point_;
    if ((this->specs_).precision <= (int)uVar5) {
      if ((this->specs_).field_0x4 == '\x02') {
        return pwVar3;
      }
      it[1] = L'0';
      return it + 2;
    }
  }
  local_38 = CONCAT44(local_38._4_4_,0x30);
  pwVar3 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar3);
  return pwVar3;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }